

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::objectQuerySingleInternal::cbtCompoundLeafCallback::ProcessChild
          (cbtCompoundLeafCallback *this,int index,cbtTransform *childTrans,
          cbtCollisionShape *childCollisionShape)

{
  cbtCollisionObjectWrapper tmpObj;
  cbtTransform childWorldTrans;
  cbtCollisionObjectWrapper local_b0;
  ConvexResultCallback local_88;
  ConvexResultCallback *local_70;
  int local_68;
  cbtTransform local_60;
  
  cbtTransform::operator*(&local_60,this->m_colObjWorldTransform,childTrans);
  local_70 = this->m_resultCallback;
  local_88.m_collisionFilterGroup = 1;
  local_88.m_collisionFilterMask = -1;
  local_88._vptr_ConvexResultCallback = (_func_int **)&PTR__ConvexResultCallback_01193f60;
  local_88.m_closestHitFraction = local_70->m_closestHitFraction;
  local_b0.m_parent = this->m_colObjWrap;
  local_b0.m_collisionObject = (local_b0.m_parent)->m_collisionObject;
  local_b0.m_partId = -1;
  local_b0.m_shape = childCollisionShape;
  local_b0.m_worldTransform = &local_60;
  local_b0.m_index = index;
  local_68 = index;
  objectQuerySingleInternal
            (this->m_castShape,this->m_convexFromTrans,this->m_convexToTrans,&local_b0,&local_88,
             this->m_allowedPenetration);
  return;
}

Assistant:

void ProcessChild(int index, const cbtTransform& childTrans, const cbtCollisionShape* childCollisionShape)
					{
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						struct LocalInfoAdder : public ConvexResultCallback
						{
							ConvexResultCallback* m_userCallback;
							int m_i;

							LocalInfoAdder(int i, ConvexResultCallback* user)
								: m_userCallback(user), m_i(i)
							{
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
							}
							virtual bool needsCollision(cbtBroadphaseProxy* p) const
							{
								return m_userCallback->needsCollision(p);
							}
							virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}
						};

						LocalInfoAdder my_cb(index, &m_resultCallback);

						cbtCollisionObjectWrapper tmpObj(m_colObjWrap, childCollisionShape, m_colObjWrap->getCollisionObject(), childWorldTrans, -1, index);

						objectQuerySingleInternal(m_castShape, m_convexFromTrans, m_convexToTrans, &tmpObj, my_cb, m_allowedPenetration);
					}